

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

void __thiscall sznet::LogStream::_formatInteger<unsigned_int>(LogStream *this,uint v)

{
  int iVar1;
  char *buf;
  size_t len_00;
  size_t len;
  uint v_local;
  LogStream *this_local;
  
  iVar1 = detail::FixedBuffer<4000>::avail(&this->m_buffer);
  if (0x1f < iVar1) {
    buf = detail::FixedBuffer<4000>::current(&this->m_buffer);
    len_00 = detail::convert<unsigned_int>(buf,v);
    detail::FixedBuffer<4000>::add(&this->m_buffer,len_00);
  }
  return;
}

Assistant:

void LogStream::_formatInteger(T v)
{
	if (m_buffer.avail() >= kMaxNumericSize)
	{
		size_t len = detail::convert(m_buffer.current(), v);
		m_buffer.add(len);
	}
}